

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msvq.cc
# Opt level: O1

int main(int argc,char **argv)

{
  bool bVar1;
  char cVar2;
  int iVar3;
  size_t sVar4;
  int iVar5;
  uint uVar6;
  ulong uVar7;
  string *input_stream;
  long lVar8;
  int iVar9;
  char *pcVar10;
  byte bVar11;
  bool bVar12;
  int num_order;
  vector<const_char_*,_std::allocator<const_char_*>_> codebook_vectors_file;
  Buffer buffer;
  vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
  codebook_vectors;
  MultistageVectorQuantization multistage_vector_quantization;
  vector<double,_std::allocator<double>_> tmp;
  vector<int,_std::allocator<int>_> codebook_indices;
  vector<double,_std::allocator<double>_> input_vector;
  ifstream ifs;
  int local_4c8;
  byte local_4c1;
  int local_4c0;
  uint local_4bc;
  string local_4b8;
  void *local_498;
  iterator iStack_490;
  char **local_488;
  Buffer local_478;
  ulong local_458;
  char **local_450;
  vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
  local_448;
  ulong local_430;
  MultistageVectorQuantization local_428;
  string local_3e0 [3];
  ios_base local_370 [264];
  vector<int,_std::allocator<int>_> local_268;
  vector<double,_std::allocator<double>_> local_250;
  string local_238;
  uint auStack_218 [20];
  ios_base local_1c8 [408];
  
  local_4c8 = 0x19;
  local_498 = (void *)0x0;
  iStack_490._M_current = (char **)0x0;
  local_488 = (char **)0x0;
  iVar9 = 0;
  local_4c0 = argc;
  local_450 = argv;
  do {
    iVar3 = ya_getopt_long(argc,local_450,"l:m:s:h",(option *)0x0,(int *)0x0);
    if (iVar3 < 0x6c) {
      iVar5 = 2;
      if (iVar3 != -1) {
        if (iVar3 == 0x68) {
          anon_unknown.dwarf_6109::PrintUsage((ostream *)&std::cout);
          iVar9 = 0;
          iVar5 = 1;
        }
        else {
LAB_00103967:
          iVar5 = 1;
          anon_unknown.dwarf_6109::PrintUsage((ostream *)&std::cerr);
          iVar9 = 1;
        }
      }
    }
    else if (iVar3 == 0x6c) {
      std::__cxx11::string::string((string *)&local_238,ya_optarg,(allocator *)local_3e0);
      bVar12 = sptk::ConvertStringToInteger(&local_238,&local_4c8);
      bVar1 = 0 < local_4c8;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_238._M_dataplus._M_p != &local_238.field_2) {
        operator_delete(local_238._M_dataplus._M_p);
      }
      if (bVar12 && bVar1) {
        local_4c8 = local_4c8 + -1;
        goto LAB_0010395c;
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_238);
      argc = local_4c0;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_238,"The argument for the -l option must be a positive integer",
                 0x39);
      local_3e0[0]._M_dataplus._M_p = (pointer)&local_3e0[0].field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_3e0,"msvq","");
      sptk::PrintErrorMessage(local_3e0,(ostringstream *)&local_238);
LAB_00103a3b:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3e0[0]._M_dataplus._M_p != &local_3e0[0].field_2) {
        operator_delete(local_3e0[0]._M_dataplus._M_p);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_238);
      std::ios_base::~ios_base(local_1c8);
      iVar5 = 1;
      iVar9 = 1;
    }
    else if (iVar3 == 0x6d) {
      std::__cxx11::string::string((string *)&local_238,ya_optarg,(allocator *)local_3e0);
      bVar1 = sptk::ConvertStringToInteger(&local_238,&local_4c8);
      bVar12 = local_4c8 < 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_238._M_dataplus._M_p != &local_238.field_2) {
        operator_delete(local_238._M_dataplus._M_p);
      }
      if (!bVar1 || bVar12) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_238);
        argc = local_4c0;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_238,"The argument for the -m option must be a ",0x29);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_238,"non-negative integer",0x14);
        local_3e0[0]._M_dataplus._M_p = (pointer)&local_3e0[0].field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_3e0,"msvq","");
        sptk::PrintErrorMessage(local_3e0,(ostringstream *)&local_238);
        goto LAB_00103a3b;
      }
LAB_0010395c:
      iVar5 = 0;
      argc = local_4c0;
    }
    else {
      if (iVar3 != 0x73) goto LAB_00103967;
      if (iStack_490._M_current == local_488) {
        std::vector<char_const*,std::allocator<char_const*>>::_M_realloc_insert<char_const*const&>
                  ((vector<char_const*,std::allocator<char_const*>> *)&local_498,iStack_490,
                   &ya_optarg);
      }
      else {
        *iStack_490._M_current = ya_optarg;
        iStack_490._M_current = iStack_490._M_current + 1;
      }
      iVar5 = 0;
    }
  } while (iVar5 == 0);
  if (iVar5 == 2) {
    uVar7 = (ulong)((long)iStack_490._M_current - (long)local_498) >> 3;
    uVar6 = (uint)uVar7;
    if (uVar6 == 0) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_238);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_238,"One or more -s options are required",0x23);
      local_3e0[0]._M_dataplus._M_p = (pointer)&local_3e0[0].field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_3e0,"msvq","");
      sptk::PrintErrorMessage(local_3e0,(ostringstream *)&local_238);
    }
    else {
      bVar1 = sptk::SetBinaryMode();
      if (bVar1) {
        lVar8 = (long)local_4c8;
        local_448.
        super__Vector_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_448.
        super__Vector_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_448.
        super__Vector_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        bVar11 = 0 < (int)uVar6;
        iVar3 = (int)(lVar8 + 1U);
        local_458 = uVar7;
        if (0 < (int)uVar6) {
          local_430 = (ulong)(uVar6 & 0x7fffffff);
          uVar7 = 0;
          do {
            local_478._vptr_Buffer = (_func_int **)0x0;
            local_478.quantization_error_.super__Vector_base<double,_std::allocator<double>_>.
            _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            local_478.quantization_error_.super__Vector_base<double,_std::allocator<double>_>.
            _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            local_4c1 = bVar11;
            std::ifstream::ifstream(&local_238);
            std::ifstream::open((char *)&local_238,
                                (_Ios_Openmode)*(undefined8 *)((long)local_498 + uVar7 * 8));
            local_4bc = *(uint *)((long)auStack_218 + *(long *)(local_238._M_dataplus._M_p + -0x18))
            ;
            if ((local_4bc & 5) == 0) {
              std::vector<double,_std::allocator<double>_>::vector
                        ((vector<double,_std::allocator<double>_> *)local_3e0,lVar8 + 1U,
                         (allocator_type *)&local_428);
              while (bVar1 = sptk::ReadStream<double>
                                       (false,0,0,iVar3,
                                        (vector<double,_std::allocator<double>_> *)local_3e0,
                                        (istream *)&local_238,(int *)0x0), bVar1) {
                std::
                vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                ::push_back((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                             *)&local_478,(value_type *)local_3e0);
              }
              std::ifstream::close();
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_3e0[0]._M_dataplus._M_p !=
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)0x0) {
                operator_delete(local_3e0[0]._M_dataplus._M_p);
              }
            }
            else {
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3e0);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_3e0,"Cannot open file ",0x11);
              pcVar10 = *(char **)((long)local_498 + uVar7 * 8);
              if (pcVar10 == (char *)0x0) {
                std::ios::clear((int)&stack0xfffffffffffffb28 +
                                (int)*(undefined8 *)(local_3e0[0]._M_dataplus._M_p + -0x18) + 0xf8);
              }
              else {
                sVar4 = strlen(pcVar10);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_3e0,pcVar10,sVar4);
              }
              local_428._vptr_MultistageVectorQuantization =
                   (_func_int **)&local_428.vector_quantization_;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_428,"msvq","");
              sptk::PrintErrorMessage((string *)&local_428,(ostringstream *)local_3e0);
              if ((VectorQuantization *)local_428._vptr_MultistageVectorQuantization !=
                  &local_428.vector_quantization_) {
                operator_delete(local_428._vptr_MultistageVectorQuantization);
              }
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3e0);
              std::ios_base::~ios_base(local_370);
              iVar9 = 1;
            }
            std::ifstream::~ifstream(&local_238);
            if ((local_4bc & 5) != 0) {
              std::
              vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              ::~vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                         *)&local_478);
              bVar11 = local_4c1;
              break;
            }
            std::
            vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
            ::push_back(&local_448,(value_type *)&local_478);
            std::
            vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            ::~vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                       *)&local_478);
            uVar7 = uVar7 + 1;
            bVar11 = uVar7 < local_430;
          } while (uVar7 != local_430);
        }
        uVar7 = local_458;
        if ((bVar11 & 1) == 0) {
          if (local_4c0 - ya_optind < 2) {
            if (local_4c0 == ya_optind) {
              pcVar10 = (char *)0x0;
            }
            else {
              pcVar10 = local_450[ya_optind];
            }
            input_stream = &local_238;
            std::ifstream::ifstream(input_stream);
            if ((pcVar10 == (char *)0x0) ||
               (std::ifstream::open((char *)&local_238,(_Ios_Openmode)pcVar10),
               (*(byte *)((long)auStack_218 + *(long *)(local_238._M_dataplus._M_p + -0x18)) & 5) ==
               0)) {
              cVar2 = std::__basic_file<char>::is_open();
              if (cVar2 == '\0') {
                input_stream = (string *)&std::cin;
              }
              iVar9 = (int)uVar7;
              sptk::MultistageVectorQuantization::MultistageVectorQuantization
                        (&local_428,local_4c8,iVar9);
              local_478._vptr_Buffer = (_func_int **)&PTR__Buffer_00111c38;
              local_478.quantization_error_.super__Vector_base<double,_std::allocator<double>_>.
              _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              local_478.quantization_error_.super__Vector_base<double,_std::allocator<double>_>.
              _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
              local_478.quantization_error_.super__Vector_base<double,_std::allocator<double>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              if (local_428.is_valid_ == false) {
                std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3e0);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_3e0,"Failed to initialize MultistageVectorQuantization",
                           0x31);
                local_4b8._M_dataplus._M_p = (pointer)&local_4b8.field_2;
                std::__cxx11::string::_M_construct<char_const*>((string *)&local_4b8,"msvq","");
                sptk::PrintErrorMessage(&local_4b8,(ostringstream *)local_3e0);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_4b8._M_dataplus._M_p != &local_4b8.field_2) {
                  operator_delete(local_4b8._M_dataplus._M_p);
                }
                std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3e0);
                std::ios_base::~ios_base(local_370);
                iVar9 = 1;
              }
              else {
                std::vector<double,_std::allocator<double>_>::vector
                          (&local_250,(long)iVar3,(allocator_type *)local_3e0);
                std::vector<int,_std::allocator<int>_>::vector
                          (&local_268,(long)iVar9,(allocator_type *)local_3e0);
                do {
                  bVar1 = sptk::ReadStream<double>
                                    (false,0,0,iVar3,&local_250,(istream *)input_stream,(int *)0x0);
                  if (!bVar1) {
                    iVar9 = 0;
                    goto LAB_0010427a;
                  }
                  bVar1 = sptk::MultistageVectorQuantization::Run
                                    (&local_428,&local_250,&local_448,&local_268,&local_478);
                  if (!bVar1) {
                    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3e0);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_3e0,"Failed to quantize vector",0x19);
                    local_4b8._M_dataplus._M_p = (pointer)&local_4b8.field_2;
                    std::__cxx11::string::_M_construct<char_const*>((string *)&local_4b8,"msvq","");
                    sptk::PrintErrorMessage(&local_4b8,(ostringstream *)local_3e0);
                    goto LAB_00104244;
                  }
                  bVar1 = sptk::WriteStream<int>
                                    (0,iVar9,&local_268,(ostream *)&std::cout,(int *)0x0);
                } while (bVar1);
                std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3e0);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_3e0,"Failed to write codebook index",0x1e);
                local_4b8._M_dataplus._M_p = (pointer)&local_4b8.field_2;
                std::__cxx11::string::_M_construct<char_const*>((string *)&local_4b8,"msvq","");
                sptk::PrintErrorMessage(&local_4b8,(ostringstream *)local_3e0);
LAB_00104244:
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_4b8._M_dataplus._M_p != &local_4b8.field_2) {
                  operator_delete(local_4b8._M_dataplus._M_p);
                }
                std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3e0);
                std::ios_base::~ios_base(local_370);
                iVar9 = 1;
LAB_0010427a:
                if (local_268.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start != (pointer)0x0) {
                  operator_delete(local_268.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start);
                }
                if (local_250.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start != (pointer)0x0) {
                  operator_delete(local_250.super__Vector_base<double,_std::allocator<double>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
                }
              }
              local_478._vptr_Buffer = (_func_int **)&PTR__Buffer_00111c38;
              if (local_478.quantization_error_.super__Vector_base<double,_std::allocator<double>_>.
                  _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_478.quantization_error_.
                                super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                super__Vector_impl_data._M_start);
              }
            }
            else {
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3e0);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_3e0,"Cannot open file ",0x11);
              sVar4 = strlen(pcVar10);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3e0,pcVar10,sVar4)
              ;
              local_428._vptr_MultistageVectorQuantization =
                   (_func_int **)&local_428.vector_quantization_;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_428,"msvq","");
              sptk::PrintErrorMessage((string *)&local_428,(ostringstream *)local_3e0);
              if ((VectorQuantization *)local_428._vptr_MultistageVectorQuantization !=
                  &local_428.vector_quantization_) {
                operator_delete(local_428._vptr_MultistageVectorQuantization);
              }
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3e0);
              std::ios_base::~ios_base(local_370);
              iVar9 = 1;
            }
            std::ifstream::~ifstream(&local_238);
          }
          else {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_238);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&local_238,"Too many input files",0x14);
            local_3e0[0]._M_dataplus._M_p = (pointer)&local_3e0[0].field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_3e0,"msvq","");
            sptk::PrintErrorMessage(local_3e0,(ostringstream *)&local_238);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_3e0[0]._M_dataplus._M_p != &local_3e0[0].field_2) {
              operator_delete(local_3e0[0]._M_dataplus._M_p);
            }
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_238);
            std::ios_base::~ios_base(local_1c8);
            iVar9 = 1;
          }
        }
        std::
        vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
        ::~vector(&local_448);
        goto LAB_001042d3;
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_238);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_238,"Cannot set translation mode",0x1b);
      local_3e0[0]._M_dataplus._M_p = (pointer)&local_3e0[0].field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_3e0,"msvq","");
      sptk::PrintErrorMessage(local_3e0,(ostringstream *)&local_238);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3e0[0]._M_dataplus._M_p != &local_3e0[0].field_2) {
      operator_delete(local_3e0[0]._M_dataplus._M_p);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_238);
    std::ios_base::~ios_base(local_1c8);
    iVar9 = 1;
  }
LAB_001042d3:
  if (local_498 != (void *)0x0) {
    operator_delete(local_498);
  }
  return iVar9;
}

Assistant:

int main(int argc, char* argv[]) {
  int num_order(kDefaultNumOrder);
  std::vector<const char*> codebook_vectors_file;

  for (;;) {
    const int option_char(getopt_long(argc, argv, "l:m:s:h", NULL, NULL));
    if (-1 == option_char) break;

    switch (option_char) {
      case 'l': {
        if (!sptk::ConvertStringToInteger(optarg, &num_order) ||
            num_order <= 0) {
          std::ostringstream error_message;
          error_message
              << "The argument for the -l option must be a positive integer";
          sptk::PrintErrorMessage("msvq", error_message);
          return 1;
        }
        --num_order;
        break;
      }
      case 'm': {
        if (!sptk::ConvertStringToInteger(optarg, &num_order) ||
            num_order < 0) {
          std::ostringstream error_message;
          error_message << "The argument for the -m option must be a "
                        << "non-negative integer";
          sptk::PrintErrorMessage("msvq", error_message);
          return 1;
        }
        break;
      }
      case 's': {
        codebook_vectors_file.push_back(optarg);
        break;
      }
      case 'h': {
        PrintUsage(&std::cout);
        return 0;
      }
      default: {
        PrintUsage(&std::cerr);
        return 1;
      }
    }
  }

  const int num_stage(static_cast<int>(codebook_vectors_file.size()));
  if (0 == num_stage) {
    std::ostringstream error_message;
    error_message << "One or more -s options are required";
    sptk::PrintErrorMessage("msvq", error_message);
    return 1;
  }

  if (!sptk::SetBinaryMode()) {
    std::ostringstream error_message;
    error_message << "Cannot set translation mode";
    sptk::PrintErrorMessage("msvq", error_message);
    return 1;
  }

  const int length(num_order + 1);
  std::vector<std::vector<std::vector<double> > > codebook_vectors;
  for (int n(0); n < num_stage; ++n) {
    std::vector<std::vector<double> > codebook;
    {
      std::ifstream ifs;
      ifs.open(codebook_vectors_file[n], std::ios::in | std::ios::binary);
      if (ifs.fail()) {
        std::ostringstream error_message;
        error_message << "Cannot open file " << codebook_vectors_file[n];
        sptk::PrintErrorMessage("msvq", error_message);
        return 1;
      }

      std::vector<double> tmp(length);
      while (sptk::ReadStream(false, 0, 0, length, &tmp, &ifs, NULL)) {
        codebook.push_back(tmp);
      }
      ifs.close();
    }
    codebook_vectors.push_back(codebook);
  }

  const int num_input_files(argc - optind);
  if (1 < num_input_files) {
    std::ostringstream error_message;
    error_message << "Too many input files";
    sptk::PrintErrorMessage("msvq", error_message);
    return 1;
  }
  const char* input_vectors_file(0 == num_input_files ? NULL : argv[optind]);

  std::ifstream ifs;
  if (NULL != input_vectors_file) {
    ifs.open(input_vectors_file, std::ios::in | std::ios::binary);
    if (ifs.fail()) {
      std::ostringstream error_message;
      error_message << "Cannot open file " << input_vectors_file;
      sptk::PrintErrorMessage("msvq", error_message);
      return 1;
    }
  }
  std::istream& stream_for_input_vectors(ifs.is_open() ? ifs : std::cin);

  sptk::MultistageVectorQuantization multistage_vector_quantization(num_order,
                                                                    num_stage);
  sptk::MultistageVectorQuantization::Buffer buffer;
  if (!multistage_vector_quantization.IsValid()) {
    std::ostringstream error_message;
    error_message << "Failed to initialize MultistageVectorQuantization";
    sptk::PrintErrorMessage("msvq", error_message);
    return 1;
  }

  std::vector<double> input_vector(length);
  std::vector<int> codebook_indices(num_stage);

  while (sptk::ReadStream(false, 0, 0, length, &input_vector,
                          &stream_for_input_vectors, NULL)) {
    if (!multistage_vector_quantization.Run(input_vector, codebook_vectors,
                                            &codebook_indices, &buffer)) {
      std::ostringstream error_message;
      error_message << "Failed to quantize vector";
      sptk::PrintErrorMessage("msvq", error_message);
      return 1;
    }
    if (!sptk::WriteStream(0, num_stage, codebook_indices, &std::cout, NULL)) {
      std::ostringstream error_message;
      error_message << "Failed to write codebook index";
      sptk::PrintErrorMessage("msvq", error_message);
      return 1;
    }
  }

  return 0;
}